

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack26_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1a;
  *puVar1 = (in[1] & 0xfffff) << 6 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x14;
  *puVar1 = (in[2] & 0x3fff) << 0xc | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0xe;
  *puVar1 = (in[3] & 0xff) << 0x12 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 8;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 3) << 0x18 | *puVar1;
  out[5] = *puVar2 >> 2 & 0x3ffffff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[5] & 0x3fffff) << 4 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[5] >> 0x16;
  *puVar1 = (in[6] & 0xffff) << 10 | *puVar1;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack26_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;

  return in + 1;
}